

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O1

bool UTF_u8_to_U<(char)63>(UTF_US8 *us8,UTF_US32 *us32)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  undefined1 uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  bool bVar10;
  byte abStack_40 [8];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_38;
  
  if (us8->_M_string_length != 0) {
    pbVar8 = (us8->_M_dataplus)._M_p;
    pbVar9 = pbVar8 + us8->_M_string_length;
    local_38 = us32;
    do {
      bVar1 = *pbVar8;
      uVar5 = 1;
      if ((((char)bVar1 < '\0') && (uVar5 = 2, 0x1d < (byte)(bVar1 + 0x3e))) &&
         (uVar5 = 3, (bVar1 & 0xf0) != 0xe0)) {
        uVar5 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
      }
      if (uVar5 == 0) {
        bVar2 = false;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(local_38,L'?');
      }
      else {
        bVar10 = uVar5 != 1;
        if (bVar10) {
          pbVar3 = pbVar8 + 1;
          if (pbVar8 + 1 != pbVar9) {
            uVar6 = (ulong)uVar5;
            uVar7 = 1;
            do {
              abStack_40[uVar7] = pbVar8[uVar7];
              if ((2 - uVar6) + uVar7 == 1) {
                bVar10 = uVar7 + 1 < uVar6;
                pbVar8 = pbVar8 + uVar7;
                goto LAB_00104c0a;
              }
              uVar7 = uVar7 + 1;
            } while (pbVar8 + uVar7 != pbVar9);
            bVar10 = uVar7 < uVar6;
            pbVar3 = pbVar8 + uVar7;
          }
          pbVar8 = pbVar3;
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (local_38,L'?');
        }
LAB_00104c0a:
        bVar2 = true;
        if (!bVar10) {
          uVar5 = 1;
          if ((((char)bVar1 < '\0') && (uVar5 = 2, 0x1d < (byte)(bVar1 + 0x3e))) &&
             (uVar5 = 3, (bVar1 & 0xf0) != 0xe0)) {
            uVar5 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
          }
          uVar4 = (*(code *)(&DAT_00106040 + *(int *)(&DAT_00106040 + (ulong)uVar5 * 4)))();
          return (bool)uVar4;
        }
      }
    } while ((!bVar2) && (pbVar8 = pbVar8 + 1, pbVar8 != pbVar9));
  }
  return true;
}

Assistant:

inline bool
UTF_u8_to_U(const UTF_US8& us8, UTF_US32& us32)
{
    UTF_UC8 uc8[4];
    UTF_UC32 uc32;
    UTF_US8::const_iterator it, end = us8.end();
    for (it = us8.begin(); it != end; ++it)
    {
        int count = UTF_uc8_count(UTF_STATIC_CAST(UTF_UC8, *it));
        if (!count)
        {
            if (!t_default_char)
                return false;

            us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        uc8[0] = *it;
        for (int i = 1; i < count; ++i)
        {
            ++it;
            if (it == end)
            {
                if (!t_default_char)
                    return false;

                us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
                return true;
            }
            uc8[i] = *it;
        }

        if (!UTF_uc8_to_uc32(uc8, &uc32))
        {
            if (!t_default_char)
                return false;

            us32.push_back(UTF_STATIC_CAST(UTF_UC8, t_default_char));
            continue;
        }

        us32.push_back(uc32);
    }
    return true;
}